

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O3

bool __thiscall
ON_CurveArray::GetTightBoundingBox
          (ON_CurveArray *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  ON_Curve *pOVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ON_3dPointArray P;
  ON_SimpleArray<ON_3dPoint> local_60;
  ON_3dPoint local_48;
  
  if (((this->super_ON_SimpleArray<ON_Curve_*>).m_count == 1) &&
     (pOVar1 = *(this->super_ON_SimpleArray<ON_Curve_*>).m_a, pOVar1 != (ON_Curve *)0x0)) {
    iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1a])
                      (pOVar1,tight_bbox,bGrowBox,xform);
    return SUB41(iVar3,0);
  }
  if (bGrowBox) {
    bVar2 = ON_BoundingBox::IsValid(tight_bbox);
    uVar6 = 1;
    if (bVar2) goto LAB_003cfaad;
  }
  ON_BoundingBox::Destroy(tight_bbox);
  uVar6 = 0;
LAB_003cfaad:
  bVar2 = SUB41(uVar6,0);
  iVar3 = (this->super_ON_SimpleArray<ON_Curve_*>).m_count;
  if (0 < iVar3) {
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_60,iVar3 * 2);
    iVar3 = (this->super_ON_SimpleArray<ON_Curve_*>).m_count;
    if (0 < iVar3) {
      lVar4 = 0;
      do {
        pOVar1 = (this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar4];
        if (pOVar1 != (ON_Curve *)0x0) {
          ON_Curve::PointAtStart(&local_48,pOVar1);
          ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
          ON_Curve::PointAtEnd(&local_48,(this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar4]);
          ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
          iVar3 = (this->super_ON_SimpleArray<ON_Curve_*>).m_count;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar3);
    }
    bVar2 = ON_3dPointArray::GetTightBoundingBox
                      ((ON_3dPointArray *)&local_60,tight_bbox,bVar2,xform);
    uVar5 = 1;
    if (!bVar2) {
      uVar5 = uVar6;
    }
    bVar2 = SUB41(uVar5,0);
    iVar3 = (this->super_ON_SimpleArray<ON_Curve_*>).m_count;
    if (0 < iVar3) {
      lVar4 = 0;
      do {
        pOVar1 = (this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar4];
        if (pOVar1 != (ON_Curve *)0x0) {
          iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1a])
                            (pOVar1,tight_bbox,(ulong)uVar5,xform);
          uVar6 = 1;
          if ((char)iVar3 == '\0') {
            uVar6 = uVar5;
          }
          iVar3 = (this->super_ON_SimpleArray<ON_Curve_*>).m_count;
          uVar5 = uVar6;
        }
        bVar2 = SUB41(uVar5,0);
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar3);
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_60);
  }
  return bVar2;
}

Assistant:

bool ON_CurveArray::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{
  if ( 1 == m_count && m_a[0] )
  {
    return m_a[0]->GetTightBoundingBox(tight_bbox,bGrowBox,xform);
  }

  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }

  if ( m_count > 0 )
  {
    int i;
    // getting box of endpoints tends to help us avoid testing curves
    ON_3dPointArray P(2*m_count);
    for ( i = 0; i < m_count; i++ )
    {
      if ( m_a[i] )
      {
        P.Append( m_a[i]->PointAtStart() );
        P.Append( m_a[i]->PointAtEnd() );
      }
    }
    if ( P.GetTightBoundingBox(tight_bbox,bGrowBox,xform) )
    {
      bGrowBox = true;
    }

    for ( i = 0; i < m_count; i++ )
    {
      if ( m_a[i] )
      {
        if ( m_a[i]->GetTightBoundingBox(tight_bbox,bGrowBox,xform) )
        {
          bGrowBox = true;
        }
      }
    }
  }

  return (0!=bGrowBox);  
}